

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_pcm_frames_f32(drwav *pWav,drwav_uint64 framesToRead,float *pBufferOut)

{
  drwav_uint32 dVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  uint shift;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint j;
  long lVar7;
  ulong uVar8;
  drwav_int16 *pdVar9;
  float *pfVar10;
  drwav_uint64 sample;
  ulong uVar11;
  ulong uVar12;
  drwav_uint64 totalFramesRead;
  drwav_uint64 dVar13;
  bool bVar14;
  drwav_int16 samples16 [2048];
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) goto LAB_001072fa;
  if (pBufferOut == (float *)0x0) {
    dVar13 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
    return dVar13;
  }
  dVar13 = 0;
  switch(pWav->translatedFormatTag) {
  case 1:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar13 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar13;
        }
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < uVar5) {
          uVar5 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar5,samples16);
        if (dVar3 == 0) break;
        uVar8 = dVar3 * pWav->channels;
        uVar5 = (ulong)dVar1 / (ulong)pWav->channels;
        uVar2 = (uint)uVar5;
        switch(uVar2) {
        case 1:
          drwav_u8_to_f32(pBufferOut,(drwav_uint8 *)samples16,uVar8);
          break;
        case 2:
          drwav_s16_to_f32(pBufferOut,samples16,uVar8);
          break;
        case 3:
          drwav_s24_to_f32(pBufferOut,(drwav_uint8 *)samples16,uVar8);
          break;
        case 4:
          drwav_s32_to_f32(pBufferOut,(drwav_int32 *)samples16,uVar8);
          break;
        default:
          if (uVar2 < 9) {
            pdVar9 = samples16;
            pfVar10 = pBufferOut;
            for (uVar6 = 0; uVar6 <= uVar8 && uVar8 - uVar6 != 0; uVar6 = (ulong)((int)uVar6 + 1)) {
              lVar7 = 0;
              uVar11 = 0;
              uVar12 = uVar5;
              iVar4 = uVar2 * -8 + 0x40;
              while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
                uVar11 = uVar11 | (ulong)*(byte *)((long)pdVar9 + lVar7) << ((byte)iVar4 & 0x3f);
                iVar4 = iVar4 + 8;
                lVar7 = lVar7 + 1;
              }
              pdVar9 = (drwav_int16 *)((long)pdVar9 + uVar5);
              *pfVar10 = (float)((double)(long)uVar11 * 1.0842021724855044e-19);
              pfVar10 = pfVar10 + 1;
            }
          }
          else {
            memset(pBufferOut,0,uVar8 * 4);
          }
        }
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        framesToRead = framesToRead - dVar3;
        dVar13 = dVar13 + dVar3;
      }
      return dVar13;
    }
    break;
  case 2:
    dVar13 = 0;
    while( true ) {
      if (framesToRead == 0) {
        return dVar13;
      }
      uVar5 = (ulong)(0x800 / pWav->channels);
      if (framesToRead < uVar5) {
        uVar5 = framesToRead;
      }
      dVar3 = drwav_read_pcm_frames_s16(pWav,uVar5,samples16);
      if (dVar3 == 0) break;
      drwav_s16_to_f32(pBufferOut,samples16,pWav->channels * dVar3);
      pBufferOut = pBufferOut + pWav->channels * dVar3;
      framesToRead = framesToRead - dVar3;
      dVar13 = dVar13 + dVar3;
    }
    return dVar13;
  case 3:
    if (pWav->bitsPerSample == 0x20) {
      dVar13 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      return dVar13;
    }
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar13 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar13;
        }
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar5 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar5,samples16);
        if (dVar3 == 0) break;
        uVar5 = dVar3 * pWav->channels;
        uVar2 = dVar1 / pWav->channels;
        if (uVar2 == 8) {
          drwav_f64_to_f32(pBufferOut,(double *)samples16,uVar5);
        }
        else if (uVar2 == 4) {
          for (uVar8 = 0; uVar6 = uVar8 & 0xffffffff, uVar6 <= uVar5 && uVar5 - uVar6 != 0;
              uVar8 = uVar8 + 1) {
            pBufferOut[uVar8] = *(float *)(samples16 + uVar6 * 2);
          }
        }
        else {
          memset(pBufferOut,0,uVar5 * 4);
        }
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        framesToRead = framesToRead - dVar3;
        dVar13 = dVar13 + dVar3;
      }
      return dVar13;
    }
    break;
  case 4:
  case 5:
    goto switchD_00107341_caseD_4;
  case 6:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar13 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar13;
        }
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar5 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar5,samples16);
        if (dVar3 == 0) break;
        drwav_alaw_to_f32(pBufferOut,(drwav_uint8 *)samples16,pWav->channels * dVar3);
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        framesToRead = framesToRead - dVar3;
        dVar13 = dVar13 + dVar3;
      }
      return dVar13;
    }
    break;
  case 7:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar13 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar13;
        }
        uVar5 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar5 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar5,samples16);
        if (dVar3 == 0) break;
        drwav_mulaw_to_f32(pBufferOut,(drwav_uint8 *)samples16,pWav->channels * dVar3);
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        framesToRead = framesToRead - dVar3;
        dVar13 = dVar13 + dVar3;
      }
      return dVar13;
    }
    break;
  default:
    if (pWav->translatedFormatTag == 0x11) {
      dVar13 = 0;
      for (; framesToRead != 0; framesToRead = framesToRead - dVar3) {
        uVar5 = (ulong)(0x800 / pWav->channels);
        if (framesToRead < uVar5) {
          uVar5 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_s16(pWav,uVar5,samples16);
        if (dVar3 == 0) {
          return dVar13;
        }
        drwav_s16_to_f32(pBufferOut,samples16,pWav->channels * dVar3);
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        dVar13 = dVar13 + dVar3;
      }
    }
    goto switchD_00107341_caseD_4;
  }
LAB_001072fa:
  dVar13 = 0;
switchD_00107341_caseD_4:
  return dVar13;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_f32(drwav* pWav, drwav_uint64 framesToRead, float* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(float) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(float) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_f32__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_f32__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_f32__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_f32__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_f32__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_f32__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}